

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hamt_map.cpp
# Opt level: O3

void __thiscall
OneLevel_InsertFourthNode_Test::~OneLevel_InsertFourthNode_Test
          (OneLevel_InsertFourthNode_Test *this)

{
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__OneLevel_0026d770;
  std::
  unique_ptr<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::default_delete<pstore::index::hamt_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(anonymous_namespace)::hash_function,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  ::~unique_ptr(&(this->super_OneLevel).index_);
  (this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.super_Test._vptr_Test =
       (_func_int **)&PTR__IndexFixture_0026d6b0;
  pstore::database::~database
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.db_);
  in_memory_store::~in_memory_store
            (&(this->super_OneLevel).super_GenericIndexFixture.super_IndexFixture.store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x168);
  return;
}

Assistant:

TEST_F (OneLevel, InsertFourthNode) {
    transaction_type t1 = begin (db_, lock_guard{mutex_});
    this->insert_or_assign (*index_, t1, "a");
    this->insert_or_assign (*index_, t1, "b");
    this->insert_or_assign (*index_, t1, "c");

    // The node "d" is inserted into the internal heap node.
    std::pair<test_trie::iterator, bool> itp = this->insert_or_assign (*index_, t1, "d");
    std::string const & key = (*itp.first).first;
    EXPECT_EQ ("d", key);
    EXPECT_TRUE (itp.second);
    EXPECT_EQ (4U, index_->size ());
    EXPECT_TRUE (this->is_found (*index_, "d")) << "key \"d\" should be present in the index";
    {
        // Check that the trie was laid out as we expected.
        index_pointer root = index_->root ();
        this->check_is_heap_internal_node (root);
        internal_node const * const root_internal = root.untag<internal_node *> ();
        EXPECT_EQ (root_internal->get_bitmap (), 0b10000000'10001010U);
        EXPECT_EQ (4U, pstore::bit_count::pop_count (root_internal->get_bitmap ()));
        this->check_is_leaf_node ((*root_internal)[3]);
        EXPECT_GT ((*root_internal)[3].to_address (), (*root_internal)[2].to_address ());
        index_->flush (t1, db_.get_current_revision ());
        this->check_is_store_internal_node (index_->root ());
        EXPECT_TRUE (this->is_found (*index_, "d")) << "key \"d\" should be present in the index";
    }
}